

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

string * __thiscall
duckdb::ExtensionHelper::DefaultExtensionFolder_abi_cxx11_
          (string *__return_storage_ptr__,ExtensionHelper *this,FileSystem *fs)

{
  char cVar1;
  IOException *this_00;
  allocator local_a1;
  string local_a0;
  string local_80;
  string home_directory;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  (**(code **)(*(long *)this + 0xb8))(&home_directory);
  cVar1 = (**(code **)(*(long *)this + 0x68))(this,&home_directory,0);
  if (cVar1 != '\0') {
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&home_directory);
    ::std::__cxx11::string::string((string *)&local_a0,".duckdb",&local_a1);
    FileSystem::JoinPath(&local_80,(FileSystem *)this,(string *)__return_storage_ptr__,&local_a0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::string((string *)&local_a0,"extensions",&local_a1);
    FileSystem::JoinPath(&local_80,(FileSystem *)this,(string *)__return_storage_ptr__,&local_a0);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_80);
    ::std::__cxx11::string::~string((string *)&local_a0);
    ::std::__cxx11::string::~string((string *)&home_directory);
    return __return_storage_ptr__;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_80,
             "Can\'t find the home directory at \'%s\'\nSpecify a home directory using the SET home_directory=\'/path/to/dir\' option."
             ,(allocator *)&local_a0);
  ::std::__cxx11::string::string((string *)&local_40,(string *)&home_directory);
  IOException::IOException<std::__cxx11::string>(this_00,(string *)&local_80,&local_40);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

duckdb::string ExtensionHelper::DefaultExtensionFolder(FileSystem &fs) {
	string home_directory = fs.GetHomeDirectory();
	// exception if the home directory does not exist, don't create whatever we think is home
	if (!fs.DirectoryExists(home_directory)) {
		throw IOException("Can't find the home directory at '%s'\nSpecify a home directory using the SET "
		                  "home_directory='/path/to/dir' option.",
		                  home_directory);
	}
	string res = home_directory;
	res = fs.JoinPath(res, ".duckdb");
	res = fs.JoinPath(res, "extensions");
	return res;
}